

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O1

void get_interest_points(fasthessian *fh,
                        vector<interest_point,_std::allocator<interest_point>_> *interest_points)

{
  response_layer *top;
  response_layer *bottom;
  response_layer *middle;
  bool bVar1;
  long lVar2;
  long lVar3;
  int col;
  int row;
  
  if (0 < fh->octaves) {
    lVar3 = 0;
    do {
      lVar2 = 0;
      do {
        top = fh->response_map[(int)(&DAT_001ad068)[lVar3 * 4 + lVar2]];
        if (0 < top->height) {
          bottom = fh->response_map[*(int *)(&DAT_001ad060 + lVar2 * 4 + lVar3 * 0x10)];
          middle = fh->response_map[*(int *)(&DAT_001ad064 + lVar2 * 4 + lVar3 * 0x10)];
          row = 0;
          do {
            if (0 < top->width) {
              col = 0;
              do {
                bVar1 = is_extremum(row,col,top,middle,bottom,fh->thresh);
                if (bVar1) {
                  interpolate_extremum(row,col,top,middle,bottom,interest_points);
                }
                col = col + 1;
              } while (col < top->width);
            }
            row = row + 1;
          } while (row < top->height);
        }
        bVar1 = lVar2 == 0;
        lVar2 = lVar2 + 1;
      } while (bVar1);
      lVar3 = lVar3 + 1;
    } while (lVar3 < fh->octaves);
  }
  return;
}

Assistant:

void get_interest_points(struct fasthessian *fh, std::vector<struct interest_point> *interest_points) {

    assert(fh != NULL);
    assert(interest_points != NULL);

    // filter index map
    const int filter_map[NUM_OCTAVES][NUM_LAYERS] = {
        {0, 1, 2, 3},
        {1, 3, 4, 5},
        {3, 5, 6, 7},
        //{5, 7, 8, 9},
        //{7, 9, 10, 11}
    };

    // getting response layers
    struct response_layer *bottom;
    struct response_layer *middle;
    struct response_layer *top;

    // iterating through all octaves and each layer of octave in window of three (top, middle, bottom)
    for (int o = 0; o < fh->octaves; ++o) {

        // TODO: (Sebastian) allow for fh->layers != 4 as well (note that fh->layers>=3 has to hold)
        for (int i = 0; i <= 1; ++i) {

            // assigning respective bottom, middle and top response layer
            bottom = fh->response_map[filter_map[o][i]];
            middle = fh->response_map[filter_map[o][i+1]];
            top = fh->response_map[filter_map[o][i+2]];

            // iterating over middle response layer at density of the most sparse layer (always top),
            // to find maxima accreoss scale and space
            for (int r = 0; r < top->height; ++r) {
                for (int c = 0; c < top->width; ++c) {

                    // checking if current pixel position is local maximum in 3x3x3 maximum and above threshold
                    if (is_extremum(r, c, top, middle, bottom, fh->thresh)) {

                        // sub-pixel interpolating local maxium and adding to resulting interest point vector
                        interpolate_extremum(r, c, top, middle, bottom, interest_points);

                    }

                }
            }

        }
    }

}